

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::upPartials
          (BeagleCPUImpl<double,_1,_0> *this,bool byPartition,int *operations,int count,
          int cumulativeScaleIndex)

{
  int iVar1;
  double **ppdVar2;
  double *pdVar3;
  double *pdVar4;
  int *piVar5;
  int *piVar6;
  double *pdVar7;
  bool bVar8;
  bool bVar9;
  _func_int **pp_Var10;
  uint uVar11;
  int *piVar12;
  int iVar13;
  ulong uVar14;
  undefined8 uVar15;
  int *piVar16;
  double *pdVar17;
  uint uVar18;
  int iVar19;
  double *pdVar20;
  double *pdVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  double *local_b8;
  int scalingIndices [2];
  int readScalingIndex;
  long local_70;
  double *local_68;
  ulong local_60;
  double *local_58;
  long local_50;
  int *local_48;
  long local_40;
  long local_38;
  
  if (cumulativeScaleIndex == -1) {
    local_b8 = (double *)0x0;
  }
  else {
    local_b8 = this->gScaleBuffers[cumulativeScaleIndex];
  }
  if (0 < count) {
    local_48 = &this->kPatternCount;
    local_50 = (ulong)byPartition * 8 + 0x1c;
    uVar24 = (ulong)(uint)count;
    piVar16 = operations + 8;
    do {
      local_70 = (long)piVar16[-8];
      iVar1 = piVar16[-7];
      readScalingIndex = piVar16[-6];
      uVar18 = 0;
      if (byPartition) {
        uVar18 = piVar16[-1];
        if ((long)*piVar16 == -1) {
          local_b8 = (double *)0x0;
        }
        else {
          local_b8 = this->gScaleBuffers[*piVar16];
        }
      }
      uVar14 = 0;
      piVar12 = local_48;
      if (byPartition) {
        piVar12 = this->gPatternPartitionsStartPatterns + (long)(int)uVar18 + 1;
        uVar14 = (ulong)(uint)piVar12[-1];
      }
      local_40 = (long)piVar16[-5];
      local_38 = (long)piVar16[-3];
      ppdVar2 = this->gPartials;
      pdVar3 = ppdVar2[local_40];
      pdVar4 = ppdVar2[local_38];
      piVar5 = this->gTipStates[local_40];
      piVar6 = this->gTipStates[local_38];
      pdVar7 = this->gTransitionMatrices[piVar16[-4]];
      pdVar21 = this->gTransitionMatrices[piVar16[-2]];
      pdVar20 = ppdVar2[local_70];
      uVar22 = (ulong)(uint)*piVar12;
      if ((char)this->kFlags < '\0') {
        this->gActiveScalingFactors[local_70 - this->kTipCount] = 0;
        bVar25 = piVar5 == (int *)0x0 && piVar6 == (int *)0x0;
LAB_00122c6f:
        bVar8 = false;
        bVar9 = false;
        pdVar17 = (double *)0x0;
      }
      else {
        uVar11 = (uint)this->kFlags;
        if ((uVar11 >> 8 & 1) == 0) {
          if ((uVar11 >> 0x19 & 1) == 0) {
            if (iVar1 < 0) {
              if (readScalingIndex < 0) goto LAB_00122ecc;
              pdVar17 = this->gScaleBuffers[(uint)readScalingIndex];
              bVar8 = true;
              bVar25 = false;
              bVar9 = false;
              goto LAB_00122cef;
            }
          }
          else {
            if (piVar5 != (int *)0x0 || piVar6 != (int *)0x0) {
LAB_00122ecc:
              bVar25 = false;
              goto LAB_00122c6f;
            }
            local_68 = pdVar21;
            local_60 = uVar22;
            local_58 = pdVar20;
            (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x22])(this,&readScalingIndex,1);
            pdVar20 = local_58;
            pdVar21 = local_68;
            uVar22 = local_60;
          }
          pdVar17 = this->gScaleBuffers[iVar1];
        }
        else {
          pdVar17 = this->gScaleBuffers[local_70 - this->kTipCount];
        }
        bVar9 = true;
        bVar25 = false;
        bVar8 = false;
      }
LAB_00122cef:
      if (piVar5 == (int *)0x0) {
        if (piVar6 == (int *)0x0) {
          if (bVar25) {
            lVar23 = local_70 - this->kTipCount;
            (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x58])
                      (this,pdVar20,pdVar3,pdVar7,pdVar4,pdVar21,
                       this->gActiveScalingFactors + lVar23);
            if (this->gActiveScalingFactors[lVar23] != 0) {
              (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x5b])
                        (this,pdVar20,this->gAutoScaleBuffers[lVar23]);
            }
          }
          else {
            pp_Var10 = (this->super_BeagleImpl)._vptr_BeagleImpl;
            if (!bVar8) {
              (*pp_Var10[0x43])(this,pdVar20,pdVar3,pdVar7,pdVar4,pdVar21,uVar14,uVar22);
              goto joined_r0x00122f31;
            }
            (*pp_Var10[0x57])(this,pdVar20,pdVar3,pdVar7,pdVar4,pdVar21,pdVar17,uVar14,uVar22);
          }
        }
        else {
          pp_Var10 = (this->super_BeagleImpl)._vptr_BeagleImpl;
          if (!bVar8) {
            (*pp_Var10[0x42])(this,pdVar20,piVar6,pdVar21,pdVar3,pdVar7,uVar14,uVar22);
            goto joined_r0x00122e7b;
          }
          (*pp_Var10[0x55])(this,pdVar20,piVar6,pdVar21,pdVar3,pdVar7,pdVar17,uVar14,uVar22);
        }
      }
      else {
        pp_Var10 = (this->super_BeagleImpl)._vptr_BeagleImpl;
        if (piVar6 == (int *)0x0) {
          if (bVar8) {
            (*pp_Var10[0x55])(this,pdVar20,piVar5,pdVar7,pdVar4,pdVar21,pdVar17,uVar14,uVar22);
          }
          else {
            (*pp_Var10[0x42])(this,pdVar20,piVar5,pdVar7,pdVar4,pdVar21,uVar14,uVar22);
joined_r0x00122f31:
            if (bVar9) {
              pp_Var10 = (this->super_BeagleImpl)._vptr_BeagleImpl;
              if (!byPartition) goto LAB_00122f59;
LAB_00122f44:
              (*pp_Var10[0x5a])(this,pdVar20,pdVar17,local_b8,0,(ulong)uVar18);
            }
          }
        }
        else if (bVar8) {
          (*pp_Var10[0x54])(this,pdVar20,piVar5,pdVar7,piVar6,pdVar21,pdVar17,uVar14,uVar22);
        }
        else {
          (*pp_Var10[0x41])(this,pdVar20,piVar5,pdVar7,piVar6,pdVar21,uVar14,uVar22);
joined_r0x00122e7b:
          if (bVar9) {
            pp_Var10 = (this->super_BeagleImpl)._vptr_BeagleImpl;
            if (byPartition) goto LAB_00122f44;
LAB_00122f59:
            (*pp_Var10[0x59])(this,pdVar20,pdVar17,local_b8,0);
          }
        }
      }
      if ((this->kFlags & 0x100) != 0) {
        iVar1 = this->kTipCount;
        iVar13 = (int)local_38 - iVar1;
        iVar19 = (int)local_40 - iVar1;
        if ((iVar19 < 0) || (iVar13 < 0)) {
          if (iVar19 < 0) {
            if (-1 < iVar13) {
              scalingIndices[0] = iVar13;
              (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x20])
                        (this,scalingIndices,1,(ulong)(uint)((int)local_70 - iVar1));
            }
            goto LAB_00122fd8;
          }
          pp_Var10 = (this->super_BeagleImpl)._vptr_BeagleImpl;
          uVar15 = 1;
        }
        else {
          pp_Var10 = (this->super_BeagleImpl)._vptr_BeagleImpl;
          uVar15 = 2;
          scalingIndices[1] = iVar13;
        }
        scalingIndices[0] = iVar19;
        (*pp_Var10[0x20])(this,scalingIndices,uVar15);
      }
LAB_00122fd8:
      piVar16 = (int *)((long)piVar16 + local_50);
      uVar24 = uVar24 - 1;
    } while (uVar24 != 0);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::upPartials(bool byPartition,
                                                  const int* operations,
                                                  int count,
                                                  int cumulativeScaleIndex) {

    REALTYPE* cumulativeScaleBuffer = NULL;
    if (cumulativeScaleIndex != BEAGLE_OP_NONE)
        cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];

    for (int op = 0; op < count; op++) {

        int numOps = BEAGLE_OP_COUNT;
        if (byPartition)
            numOps = BEAGLE_PARTITION_OP_COUNT;

        if (DEBUGGING_OUTPUT) {
            fprintf(stderr, "op[%d] = ", op);
            for (int j = 0; j < numOps; j++) {
                std::cerr << operations[op*numOps+j] << " ";
            }
            fprintf(stderr, "\n");
        }

        const int parIndex = operations[op * numOps];
        const int writeScalingIndex = operations[op * numOps + 1];
        const int readScalingIndex = operations[op * numOps + 2];
        const int child1Index = operations[op * numOps + 3];
        const int child1TransMatIndex = operations[op * numOps + 4];
        const int child2Index = operations[op * numOps + 5];
        const int child2TransMatIndex = operations[op * numOps + 6];
        int currentPartition = 0;
        if (byPartition) {
            currentPartition = operations[op * numOps + 7];
            cumulativeScaleIndex = operations[op * numOps + 8];
            if (cumulativeScaleIndex != BEAGLE_OP_NONE)
                cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
            else
                cumulativeScaleBuffer = NULL;
        }

        const REALTYPE* partials1 = gPartials[child1Index];
        const REALTYPE* partials2 = gPartials[child2Index];

        const int* tipStates1 = gTipStates[child1Index];
        const int* tipStates2 = gTipStates[child2Index];

        const REALTYPE* matrices1 = gTransitionMatrices[child1TransMatIndex];
        const REALTYPE* matrices2 = gTransitionMatrices[child2TransMatIndex];

        REALTYPE* destPartials = gPartials[parIndex];

        int startPattern = 0;
        int endPattern = kPatternCount;
        if (byPartition) {
            startPattern = gPatternPartitionsStartPatterns[currentPartition];
            endPattern = gPatternPartitionsStartPatterns[currentPartition + 1];
        }

        int rescale = BEAGLE_OP_NONE;
        REALTYPE* scalingFactors = NULL;

        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            gActiveScalingFactors[parIndex - kTipCount] = 0;
            if (tipStates1 == 0 && tipStates2 == 0)
                rescale = 2;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            rescale = 1;
            scalingFactors = gScaleBuffers[parIndex - kTipCount];
        } else if (kFlags & BEAGLE_FLAG_SCALING_DYNAMIC) { // TODO: this is a quick and dirty implementation just so it returns correct results
            if (tipStates1 == 0 && tipStates2 == 0) {
                rescale = 1;
                removeScaleFactors(&readScalingIndex, 1, cumulativeScaleIndex);
                scalingFactors = gScaleBuffers[writeScalingIndex];
            }
        } else if (writeScalingIndex >= 0) {
            rescale = 1;
            scalingFactors = gScaleBuffers[writeScalingIndex];
        } else if (readScalingIndex >= 0) {
            rescale = 0;
            scalingFactors = gScaleBuffers[readScalingIndex];
        }

        if (DEBUGGING_OUTPUT) {
            std::cerr << "Rescale= " << rescale << " writeIndex= " << writeScalingIndex
                     << " readIndex = " << readScalingIndex << "\n";
        }

        if (tipStates1 != NULL) {
            if (tipStates2 != NULL ) {
                if (rescale == 0) { // Use fixed scaleFactors
                    calcStatesStatesFixedScaling(destPartials, tipStates1, matrices1, tipStates2,
                                                 matrices2, scalingFactors, startPattern, endPattern);
                } else {
                    // First compute without any scaling
                    calcStatesStates(destPartials, tipStates1, matrices1, tipStates2, matrices2,
                                     startPattern, endPattern);
                    if (rescale == 1) { // Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            } else {
                if (rescale == 0) {
                    calcStatesPartialsFixedScaling(destPartials, tipStates1, matrices1, partials2,
                                                   matrices2, scalingFactors, startPattern, endPattern);
                } else {
                    calcStatesPartials(destPartials, tipStates1, matrices1, partials2, matrices2,
                                       startPattern, endPattern);
                    if (rescale == 1) { // Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            }
        } else {
            if (tipStates2 != NULL) {
                if (rescale == 0) {
                    calcStatesPartialsFixedScaling(destPartials,tipStates2,matrices2,partials1,matrices1,
                                                   scalingFactors, startPattern, endPattern);
                } else {
                    calcStatesPartials(destPartials, tipStates2, matrices2, partials1, matrices1,
                                       startPattern, endPattern);
                    if (rescale == 1) {// Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            } else {
                if (rescale == 2) {
                    int sIndex = parIndex - kTipCount;
                    calcPartialsPartialsAutoScaling(destPartials,partials1,matrices1,partials2,matrices2,
                                                     &gActiveScalingFactors[sIndex]);
                    if (gActiveScalingFactors[sIndex])
                        autoRescalePartials(destPartials, gAutoScaleBuffers[sIndex]);

                } else if (rescale == 0) {
                    calcPartialsPartialsFixedScaling(destPartials,partials1,matrices1,partials2,
                                                     matrices2,scalingFactors,startPattern,endPattern);
                } else {
                    calcPartialsPartials(destPartials, partials1, matrices1, partials2, matrices2,
                                         startPattern, endPattern);
                    if (rescale == 1) {// Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            }
        }

        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            int parScalingIndex = parIndex - kTipCount;
            int child1ScalingIndex = child1Index - kTipCount;
            int child2ScalingIndex = child2Index - kTipCount;
            if (child1ScalingIndex >= 0 && child2ScalingIndex >= 0) {
                int scalingIndices[2] = {child1ScalingIndex, child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 2, parScalingIndex);
            } else if (child1ScalingIndex >= 0) {
                int scalingIndices[1] = {child1ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
            } else if (child2ScalingIndex >= 0) {
                int scalingIndices[1] = {child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
            }
        }

        if (DEBUGGING_OUTPUT) {
            if (scalingFactors != NULL && rescale == 0) {
                for(int i=0; i<kPatternCount; i++)
                    fprintf(stderr,"old scaleFactor[%d] = %.5f\n",i,scalingFactors[i]);
            }
            fprintf(stderr,"Result partials:\n");
            for(int i = 0; i < kPartialsSize; i++)
                fprintf(stderr,"destP[%d] = %.5f\n",i,destPartials[i]);
        }
    }

    return BEAGLE_SUCCESS;
}